

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O0

QTextCharFormat * __thiscall QIBusAttribute::format(QIBusAttribute *this)

{
  long in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  UnderlineStyle style;
  QTextCharFormat *fmt;
  QColor *this_00;
  QBrush local_48 [8];
  QBrush local_40 [8];
  QColor local_38;
  QColor local_28;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  *(undefined8 *)((long)&in_RDI->ct + 4) = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)in_RDI);
  switch(*(undefined4 *)(in_RSI + 0x20)) {
  case 0:
    break;
  case 1:
    switch(*(undefined4 *)(in_RSI + 0x24)) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      QColor::QColor(&local_18,red);
      QTextCharFormat::setUnderlineColor((QTextCharFormat *)this_00,in_RDI);
    }
    QTextCharFormat::setUnderlineStyle((UnderlineStyle)in_RDI);
    break;
  case 2:
    QColor::QColor(&local_28,*(uint *)(in_RSI + 0x24));
    QBrush::QBrush(local_40,&local_28,SolidPattern);
    QTextFormat::setForeground((QTextFormat *)this_00,(QBrush *)in_RDI);
    QBrush::~QBrush(local_40);
    break;
  case 3:
    QColor::QColor(&local_38,*(uint *)(in_RSI + 0x24));
    QBrush::QBrush(local_48,&local_38,SolidPattern);
    QTextFormat::setBackground((QTextFormat *)this_00,(QBrush *)in_RDI);
    QBrush::~QBrush(local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QTextCharFormat *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextCharFormat QIBusAttribute::format() const
{
    QTextCharFormat fmt;
    switch (type) {
    case Invalid:
        break;
    case Underline: {
        QTextCharFormat::UnderlineStyle style = QTextCharFormat::NoUnderline;

        switch (value) {
        case UnderlineNone:
            break;
        case UnderlineSingle:
            style = QTextCharFormat::SingleUnderline;
            break;
        case UnderlineDouble:
            style = QTextCharFormat::DashUnderline;
            break;
        case UnderlineLow:
            style = QTextCharFormat::DashDotLine;
            break;
        case UnderlineError:
            style = QTextCharFormat::WaveUnderline;
            fmt.setUnderlineColor(Qt::red);
            break;
        }

        fmt.setUnderlineStyle(style);
        break;
    }
    case Foreground:
        fmt.setForeground(QColor(value));
        break;
    case Background:
        fmt.setBackground(QColor(value));
        break;
    }
    return fmt;
}